

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::startListening(FileServer *this)

{
  bool bVar1;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var2;
  int iVar3;
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    _Var2._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    bVar1 = (_Var2._M_head_impl)->isListening;
    if (bVar1 == false) {
      (_Var2._M_head_impl)->isListening = true;
    }
    pthread_mutex_unlock(__mutex);
    return (bool)(bVar1 ^ 1);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool FileServer::startListening() {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        if (m_impl->isListening) {
            return false;
        }

        m_impl->isListening = true;
    }

    return true;
}